

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::ReplayExternalCallEvent
          (EventLog *this,JavascriptFunction *function,Arguments *args,Var *result)

{
  ScriptContext *scriptContext;
  ThreadContextTTD *executeContext;
  ThreadContext *pTVar1;
  bool bVar2;
  uint uVar3;
  ExternalCallEventLogEntry *pEVar4;
  EventLogEntry *pEVar5;
  Var pvVar6;
  JavascriptExceptionObject *exceptionObject;
  RecyclableObject *pRVar7;
  RecyclableData *pRVar8;
  undefined8 uVar9;
  void *__frameAddr;
  ulong uVar10;
  undefined1 local_68 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  if (result == (Var *)0x0) {
    TTDAbort_unrecoverable_error("Must be non-null!!!");
  }
  if (*result != (Var)0x0) {
    TTDAbort_unrecoverable_error("And initialized to a default value.");
  }
  pEVar4 = ReplayGetReplayEvent_Helper<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (this);
  scriptContext =
       (((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
       ->super_JavascriptLibraryBase).scriptContext.ptr;
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("Not sure how this would be possible but check just in case.");
  }
  __leaveScriptObject._32_8_ = result;
  if ((*(uint *)&args->Info & 0xffffff) + 1 != pEVar4->ArgCount) {
    TTDAbort_unrecoverable_error("Mismatch in args!!!");
  }
  executeContext = scriptContext->threadContext->TTDContext;
  NSLogEvents::PassVarToHostInReplay(executeContext,*pEVar4->ArgArray,function);
  for (uVar10 = 0; uVar3 = SUB84(args->Info,0), uVar10 < (uVar3 & 0xffffff); uVar10 = uVar10 + 1) {
    NSLogEvents::PassVarToHostInReplay
              (executeContext,pEVar4->ArgArray[uVar10 + 1],args->Values[uVar10]);
  }
  if ((uVar3 >> 0x1e & 1) == 0) {
    if (pEVar4->NewTarget == (TTDVar)0x0) {
LAB_0080892a:
      Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_68,scriptContext,
                 &stack0xfffffffffffffff8);
      pTVar1 = scriptContext->threadContext;
      bVar2 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      ReplayActionEventSequenceThroughTime(this,pEVar4->LastNestedEventTime);
      ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
      pTVar1->reentrancySafeOrHandled = bVar2;
      Js::LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_68);
      bVar2 = TTEventList::Iterator::IsValid(&this->m_currentReplayEventIterator);
      if ((bVar2) &&
         (pEVar5 = TTEventList::Iterator::Current(&this->m_currentReplayEventIterator),
         pEVar5->EventTimeStamp != this->m_eventTimeCtr)) {
        TTDAbort_unrecoverable_error("Out of Sync!!!");
      }
      pvVar6 = NSLogEvents::InflateVarInReplay(executeContext,pEVar4->ReturnValue);
      uVar9 = __leaveScriptObject._32_8_;
      *(Var *)__leaveScriptObject._32_8_ = pvVar6;
      if (pEVar4->CheckExceptionStatus == true) {
        bVar2 = Js::ScriptContext::HasRecordedException(scriptContext);
        if (bVar2) {
          local_68[0] = false;
          exceptionObject =
               Js::ScriptContext::GetAndClearRecordedException(scriptContext,(bool *)local_68);
          if (exceptionObject != (JavascriptExceptionObject *)0x0) {
            pRVar8 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                               (&scriptContext->threadContext->recyclableData);
            if (exceptionObject != &pRVar8->terminatedErrorObject) {
              Js::JavascriptExceptionOperators::RethrowExceptionObject
                        (exceptionObject,scriptContext,local_68[0]);
            }
            uVar9 = __cxa_allocate_exception(1);
            __cxa_throw(uVar9,&Js::ScriptAbortException::typeinfo,0);
          }
        }
        pvVar6 = *(Var *)uVar9;
      }
      if (pvVar6 == (Var)0x0) {
        pRVar7 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        pRVar7 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pvVar6,false);
      }
      *(RecyclableObject **)uVar9 = pRVar7;
      return;
    }
  }
  else if (pEVar4->NewTarget != (TTDVar)0x0) {
    pvVar6 = Js::Arguments::GetNewTarget(args);
    NSLogEvents::PassVarToHostInReplay(executeContext,pEVar4->NewTarget,pvVar6);
    goto LAB_0080892a;
  }
  TTDAbort_unrecoverable_error("Mismatch in new.target!!!");
}

Assistant:

void EventLog::ReplayExternalCallEvent(Js::JavascriptFunction* function, const Js::Arguments& args, Js::Var* result)
    {
        TTDAssert(result != nullptr, "Must be non-null!!!");
        TTDAssert(*result == nullptr, "And initialized to a default value.");

        const NSLogEvents::ExternalCallEventLogEntry* ecEvent = this->ReplayGetReplayEvent_Helper<NSLogEvents::ExternalCallEventLogEntry, NSLogEvents::EventKind::ExternalCallTag>();

        Js::ScriptContext* ctx = function->GetScriptContext();
        TTDAssert(ctx != nullptr, "Not sure how this would be possible but check just in case.");

        ThreadContextTTD* executeContext = ctx->GetThreadContext()->TTDContext;

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteCall(function, true, args.Info.Count, args.Values, this->GetLastEventTime());
#endif

        //make sure we log all of the passed arguments in the replay host
        TTDAssert(args.Info.Count + 1 == ecEvent->ArgCount, "Mismatch in args!!!");

        TTDVar recordedFunction = ecEvent->ArgArray[0];
        NSLogEvents::PassVarToHostInReplay(executeContext, recordedFunction, function);

        for(uint32 i = 0; i < args.Info.Count; ++i)
        {
            Js::Var replayVar = args.Values[i];
            TTDVar recordedVar = ecEvent->ArgArray[i + 1];
            NSLogEvents::PassVarToHostInReplay(executeContext, recordedVar, replayVar);
        }

        if (args.HasNewTarget())
        {
            TTDAssert(ecEvent->NewTarget != nullptr, "Mismatch in new.target!!!");
            Js::Var replayVar = args.GetNewTarget();
            TTDVar recordedVar = ecEvent->NewTarget;
            NSLogEvents::PassVarToHostInReplay(executeContext, recordedVar, replayVar);
        }
        else
        {
            TTDAssert(ecEvent->NewTarget == nullptr, "Mismatch in new.target!!!");
        }

        //replay anything that happens in the external call
        BEGIN_LEAVE_SCRIPT(ctx)
        {
            this->ReplayActionEventSequenceThroughTime(ecEvent->LastNestedEventTime);
        }
        END_LEAVE_SCRIPT(ctx);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        TTDAssert(!this->m_currentReplayEventIterator.IsValid() || this->m_currentReplayEventIterator.Current()->EventTimeStamp == this->m_eventTimeCtr, "Out of Sync!!!");
#endif

        *result = NSLogEvents::InflateVarInReplay(executeContext, ecEvent->ReturnValue);

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteReturn(function, *result, this->GetLastEventTime());
#endif

        //if we had exception info then we need to patch it up and do what the external call did
        if(ecEvent->CheckExceptionStatus)
        {
            if(ctx->HasRecordedException())
            {
                bool considerPassingToDebugger = false;
                Js::JavascriptExceptionObject* recordedException = ctx->GetAndClearRecordedException(&considerPassingToDebugger);
                if(recordedException != nullptr)
                {
                    // If this is script termination, then throw ScriptAbortExceptio, else throw normal Exception object.
                    if(recordedException == ctx->GetThreadContext()->GetPendingTerminatedErrorObject())
                    {
                        throw Js::ScriptAbortException();
                    }
                    else
                    {
                        Js::JavascriptExceptionOperators::RethrowExceptionObject(recordedException, ctx, considerPassingToDebugger);
                    }
                }
            }
        }

        if(*result == nullptr)
        {
            *result = ctx->GetLibrary()->GetUndefined();
        }
        else
        {
            *result = Js::CrossSite::MarshalVar(ctx, *result);
        }
    }